

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
* __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectSDLCreateWindow
          (SDLGraphicsSystemTests *this,string *title,uint width,uint height)

{
  WrapperMock *this_00;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *pTVar1;
  MatcherBase<int> MStack_148;
  MatcherBase<int> local_130;
  MatcherBase<int> local_118;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_100;
  MatcherBase<unsigned_int> local_e8;
  MatcherBase<int> local_d0;
  MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  local_b8;
  
  this_00 = &((this->sdlMock).rawPointer)->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_100,title);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_118,0x1fff0000);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_130,0x1fff0000);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_148,width);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_d0,height);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_e8,4);
  SDL::WrapperMock::gmock_createWindow
            (&local_b8,this_00,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_100,(Matcher<int> *)&local_118,(Matcher<int> *)&local_130,
             (Matcher<int> *)&MStack_148,(Matcher<int> *)&local_d0,
             (Matcher<unsigned_int> *)&local_e8);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
           ::InternalExpectedAt
                     (&local_b8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                      ,0x48,"*sdlMock",
                      "createWindow( title, (0x1FFF0000u|(0)), (0x1FFF0000u|(0)), width, height, SDL_WINDOW_SHOWN)"
                     );
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  ::~_Tuple_impl(&local_b8.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                );
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_e8);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_d0);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_148);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_130);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_118);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_100);
  return pTVar1;
}

Assistant:

auto& expectSDLCreateWindow(
        const std::string& title, unsigned width, unsigned height)
    {
        return EXPECT_CALL(*sdlMock, createWindow(
            title, SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED,
            width, height, SDL_WINDOW_SHOWN)
        );
    }